

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_serialize_container
          (t_netstd_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  t_netstd_generator *this_00;
  string *iter_00;
  string sStack_128;
  string iter;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  t_generator::indent_abi_cxx11_(&iter,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&iter);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&iter);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&iter,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&iter);
      pcVar4 = "await oprot.WriteSetBeginAsync(new TSet(";
      poVar3 = std::operator<<(poVar3,"await oprot.WriteSetBeginAsync(new TSet(");
      type_to_enum_abi_cxx11_
                (&sStack_128,(t_netstd_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_
                );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".Count), ");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_00258afb;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&iter,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&iter);
      pcVar4 = "await oprot.WriteListBeginAsync(new TList(";
      poVar3 = std::operator<<(poVar3,"await oprot.WriteListBeginAsync(new TList(");
      type_to_enum_abi_cxx11_
                (&sStack_128,(t_netstd_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_
                );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,".Count), ");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_00258afb;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&iter,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&iter);
    pcVar4 = "await oprot.WriteMapBeginAsync(new TMap(";
    poVar3 = std::operator<<(poVar3,"await oprot.WriteMapBeginAsync(new TMap(");
    type_to_enum_abi_cxx11_
              (&sStack_128,(t_netstd_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar3 = std::operator<<(poVar3,(string *)&sStack_128);
    this_00 = (t_netstd_generator *)0x2fdaef;
    poVar3 = std::operator<<(poVar3,", ");
    type_to_enum_abi_cxx11_(&local_e8,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".Count), ");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e8);
LAB_00258afb:
    std::__cxx11::string::~string((string *)&sStack_128);
    std::__cxx11::string::~string((string *)&iter);
  }
  std::__cxx11::string::string((string *)&local_a8,"_iter",(allocator *)&sStack_128);
  t_generator::tmp(&iter,(t_generator *)this,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,"foreach (");
      type_name_abi_cxx11_(&local_e8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_e8);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&iter);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      std::operator<<(poVar3,")");
      goto LAB_00258d39;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,"foreach (");
      type_name_abi_cxx11_(&local_e8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
      poVar3 = std::operator<<(poVar3,(string *)&local_e8);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::operator<<(poVar3,(string *)&iter);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      std::operator<<(poVar3,")");
      goto LAB_00258d39;
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&sStack_128);
    poVar3 = std::operator<<(poVar3,"foreach (");
    type_name_abi_cxx11_(&local_e8,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,true);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)&iter);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    std::operator<<(poVar3,".Keys)");
LAB_00258d39:
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&sStack_128);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_128);
  poVar3 = std::operator<<(poVar3,"{");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_128);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      iter_00 = &local_48;
      std::__cxx11::string::string((string *)iter_00,(string *)&iter);
      generate_serialize_set_element(this,out,(t_set *)ttype,iter_00);
      goto LAB_00258e5e;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      iter_00 = &local_68;
      std::__cxx11::string::string((string *)iter_00,(string *)&iter);
      generate_serialize_list_element(this,out,(t_list *)ttype,iter_00);
      goto LAB_00258e5e;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_88,(string *)&iter);
    std::__cxx11::string::string((string *)&local_c8,(string *)prefix);
    iter_00 = &local_88;
    generate_serialize_map_element(this,out,(t_map *)ttype,iter_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
LAB_00258e5e:
    std::__cxx11::string::~string((string *)iter_00);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_128);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_128);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00258fd8;
      t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteListEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&sStack_128);
      poVar3 = std::operator<<(poVar3,"await oprot.WriteSetEndAsync(");
      poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
    poVar3 = std::operator<<(out,(string *)&sStack_128);
    poVar3 = std::operator<<(poVar3,"await oprot.WriteMapEndAsync(");
    poVar3 = std::operator<<(poVar3,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&sStack_128);
LAB_00258fd8:
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_128,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_128);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_128);
  std::__cxx11::string::~string((string *)&iter);
  return;
}

Assistant:

void t_netstd_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix)
{
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapBeginAsync(new TMap(" << type_to_enum(static_cast<t_map*>(ttype)->get_key_type())
            << ", " << type_to_enum(static_cast<t_map*>(ttype)->get_val_type()) << ", " << prefix
            << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetBeginAsync(new TSet(" << type_to_enum(static_cast<t_set*>(ttype)->get_elem_type())
            << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListBeginAsync(new TList("
            << type_to_enum(static_cast<t_list*>(ttype)->get_elem_type()) << ", " << prefix << ".Count), " << CANCELLATION_TOKEN_NAME << ");"
            << endl;
    }

    string iter = tmp("_iter");
    if (ttype->is_map())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_map*>(ttype)->get_key_type()) << " " << iter
            << " in " << prefix << ".Keys)";
    }
    else if (ttype->is_set())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_set*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }
    else if (ttype->is_list())
    {
        out << indent() << "foreach (" << type_name(static_cast<t_list*>(ttype)->get_elem_type()) << " " << iter
            << " in " << prefix << ")";
    }

    out << endl;
    out << indent() << "{" << endl;
    indent_up();

    if (ttype->is_map())
    {
        generate_serialize_map_element(out, static_cast<t_map*>(ttype), iter, prefix);
    }
    else if (ttype->is_set())
    {
        generate_serialize_set_element(out, static_cast<t_set*>(ttype), iter);
    }
    else if (ttype->is_list())
    {
        generate_serialize_list_element(out, static_cast<t_list*>(ttype), iter);
    }

    indent_down();
    out << indent() << "}" << endl;

    if (ttype->is_map())
    {
        out << indent() << "await oprot.WriteMapEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_set())
    {
        out << indent() << "await oprot.WriteSetEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    else if (ttype->is_list())
    {
        out << indent() << "await oprot.WriteListEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl;
}